

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O3

uint __thiscall RegVmLoweredModule::FindConstant(RegVmLoweredModule *this,uint value1,uint value2)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  
  uVar1 = (this->constants).count;
  if (1 < uVar1) {
    puVar2 = (this->constants).data;
    uVar3 = 1;
    do {
      if ((puVar2[uVar3 - 1] == value1) && (puVar2[uVar3] == value2)) {
        return uVar3;
      }
      uVar3 = uVar3 + 2;
    } while (uVar3 < uVar1);
  }
  return 0;
}

Assistant:

unsigned RegVmLoweredModule::FindConstant(unsigned value1, unsigned value2)
{
	for(unsigned i = 0; i + 1 < constants.size(); i += 2)
	{
		if(constants[i] == value1 && constants[i + 1] == value2)
			return i + 1;
	}

	return 0;
}